

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::FboStateQueryTests::init(FboStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  Context *context;
  int extraout_EAX;
  ApiCase *pAVar2;
  TestNode *pTVar3;
  char *pcVar4;
  long lVar5;
  allocator<char> local_79;
  ApiCase *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 0x10) {
    local_78 = (ApiCase *)operator_new(0xa0);
    context = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,*(char **)((long)&PTR_anon_var_dwarf_1bd0805_01e364a0 + lVar5),
               &local_79);
    std::operator+(&local_70,&local_50,"default_framebuffer");
    pAVar2 = local_78;
    uVar1 = *(undefined4 *)((long)&DAT_01e364a8 + lVar5);
    ApiCase::ApiCase(local_78,context,local_70._M_dataplus._M_p,"default framebuffer");
    (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e364e8;
    *(undefined4 *)&pAVar2[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,"framebuffer_attachment_object",
                   "FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE and FRAMEBUFFER_ATTACHMENT_OBJECT_NAME");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e36540;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_attachment_texture_level","FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e36598;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_attachment_texture_cube_map_face",
                   "FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e365f0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_attachment_texture_layer","FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e36648;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_attachment_color_encoding","FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e366a0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_attachment_component_type","FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e366f8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  pcVar4 = "FRAMEBUFFER_ATTACHMENT_x_SIZE";
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_attachment_x_size_initial","FRAMEBUFFER_ATTACHMENT_x_SIZE");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e36750;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pTVar3 = (TestNode *)operator_new(0x98);
  anon_unknown_1::AttachmentSizeCase::AttachmentSizeCase
            ((AttachmentSizeCase *)pTVar3,(this->super_TestCaseGroup).m_context,
             "framebuffer_attachment_x_size_rbo",pcVar4);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__ApiCase_01e367a8;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x98);
  anon_unknown_1::AttachmentSizeCase::AttachmentSizeCase
            ((AttachmentSizeCase *)pTVar3,(this->super_TestCaseGroup).m_context,
             "framebuffer_attachment_x_size_texture",pcVar4);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__ApiCase_01e36878;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_unspecified_attachment_color_encoding",
                   "FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e368e0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  pcVar4 = "FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE";
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_unspecified_attachment_component_type",
                   "FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e36938;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pTVar3 = (TestNode *)operator_new(0x98);
  anon_unknown_1::UnspecifiedAttachmentSizeCase::UnspecifiedAttachmentSizeCase
            ((UnspecifiedAttachmentSizeCase *)pTVar3,(this->super_TestCaseGroup).m_context,
             "framebuffer_unspecified_attachment_x_size_rbo",pcVar4);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__ApiCase_01e36990;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x98);
  anon_unknown_1::UnspecifiedAttachmentSizeCase::UnspecifiedAttachmentSizeCase
            ((UnspecifiedAttachmentSizeCase *)pTVar3,(this->super_TestCaseGroup).m_context,
             "framebuffer_unspecified_attachment_x_size_texture",pcVar4);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__ApiCase_01e36a60;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  return extraout_EAX;
}

Assistant:

void FboStateQueryTests::init (void)
{
	const struct FramebufferTarget
	{
		const char*	name;
		GLenum		target;
	} fboTargets[] =
	{
		{ "draw_framebuffer_", GL_DRAW_FRAMEBUFFER },
		{ "read_framebuffer_", GL_READ_FRAMEBUFFER }
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(fboTargets); ++ndx)
		addChild(new DefaultFramebufferCase(m_context, (std::string(fboTargets[ndx].name) + "default_framebuffer").c_str(), "default framebuffer", fboTargets[ndx].target));

	addChild(new AttachmentObjectCase							(m_context, "framebuffer_attachment_object",							"FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE and FRAMEBUFFER_ATTACHMENT_OBJECT_NAME"));
	addChild(new AttachmentTextureLevelCase						(m_context, "framebuffer_attachment_texture_level",						"FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL"));
	addChild(new AttachmentTextureCubeMapFaceCase				(m_context, "framebuffer_attachment_texture_cube_map_face",				"FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE"));
	addChild(new AttachmentTextureLayerCase						(m_context, "framebuffer_attachment_texture_layer",						"FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER"));
	addChild(new AttachmentTextureColorCodingCase				(m_context, "framebuffer_attachment_color_encoding",					"FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING"));
	addChild(new AttachmentTextureComponentTypeCase				(m_context, "framebuffer_attachment_component_type",					"FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE"));
	addChild(new AttachmentSizeInitialCase						(m_context, "framebuffer_attachment_x_size_initial",					"FRAMEBUFFER_ATTACHMENT_x_SIZE"));
	addChild(new AttachmentSizeRboCase							(m_context, "framebuffer_attachment_x_size_rbo",						"FRAMEBUFFER_ATTACHMENT_x_SIZE"));
	addChild(new AttachmentSizeTextureCase						(m_context, "framebuffer_attachment_x_size_texture",					"FRAMEBUFFER_ATTACHMENT_x_SIZE"));

	addChild(new UnspecifiedAttachmentTextureColorCodingCase	(m_context, "framebuffer_unspecified_attachment_color_encoding",		"FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING"));
	addChild(new UnspecifiedAttachmentTextureComponentTypeCase	(m_context, "framebuffer_unspecified_attachment_component_type",		"FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE"));
	addChild(new UnspecifiedAttachmentSizeRboCase				(m_context, "framebuffer_unspecified_attachment_x_size_rbo",			"FRAMEBUFFER_ATTACHMENT_x_SIZE"));
	addChild(new UnspecifiedAttachmentSizeTextureCase			(m_context, "framebuffer_unspecified_attachment_x_size_texture",		"FRAMEBUFFER_ATTACHMENT_x_SIZE"));
}